

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::eliminatePivot(CLUFactor<double> *this,int prow,int pos,double eps)

{
  double val;
  int iVar1;
  int iVar2;
  pointer pdVar3;
  Pring *pPVar4;
  Pring *pPVar5;
  Pring *pPVar6;
  int *piVar7;
  int *piVar8;
  double *pdVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  
  piVar14 = (this->u).row.len;
  lVar20 = (long)(this->u).row.start[prow];
  iVar12 = piVar14[prow];
  iVar16 = iVar12 + -1;
  piVar14[prow] = iVar16;
  lVar19 = pos + lVar20;
  pdVar3 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar14 = (this->u).row.idx;
  iVar1 = piVar14[lVar19];
  val = pdVar3[lVar19];
  pPVar4 = (this->temp).pivot_col;
  pPVar5 = pPVar4[iVar1].next;
  pPVar6 = pPVar4[iVar1].prev;
  pPVar5->prev = pPVar6;
  pPVar6->next = pPVar5;
  pPVar4[iVar1].next = pPVar4 + iVar1;
  pPVar4[iVar1].prev = pPVar4 + iVar1;
  lVar21 = (long)iVar12 + -1 + lVar20;
  piVar14[lVar19] = piVar14[lVar21];
  pdVar3[lVar19] = pdVar3[lVar21];
  iVar12 = (this->temp).stage;
  (this->temp).stage = iVar12 + 1;
  setPivot(this,iVar12,iVar1,prow,val);
  piVar14 = (this->temp).s_cact;
  if (piVar14[iVar1] < 2) {
    iVar12 = -1;
  }
  else {
    iVar12 = makeLvec(this,piVar14[iVar1] + -1,prow);
    piVar14 = (this->temp).s_cact;
  }
  pdVar3 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->u).row.idx;
  piVar8 = (this->temp).s_mark;
  pdVar9 = this->work;
  pPVar4 = (this->temp).pivot_col;
  piVar15 = (this->u).col.start;
  piVar10 = (this->u).col.len;
  piVar13 = (this->u).col.idx;
  for (; lVar20 < lVar21; lVar20 = lVar20 + 1) {
    iVar2 = piVar7[lVar20];
    piVar8[iVar2] = 1;
    pdVar9[iVar2] = pdVar3[lVar20];
    pPVar5 = pPVar4[iVar2].next;
    pPVar6 = pPVar4[iVar2].prev;
    pPVar5->prev = pPVar6;
    pPVar6->next = pPVar5;
    iVar17 = (piVar10[iVar2] + piVar15[iVar2]) - piVar14[iVar2];
    piVar11 = piVar13 + iVar17;
    do {
      piVar18 = piVar11;
      piVar11 = piVar18 + 1;
    } while (*piVar18 != prow);
    *piVar18 = piVar13[iVar17];
    piVar13[iVar17] = prow;
    piVar14[iVar2] = piVar14[iVar2] + -1;
  }
  lVar21 = (long)(piVar10[iVar1] - piVar14[iVar1]);
  while (piVar13[piVar15[iVar1] + lVar21] != prow) {
    updateRow(this,piVar13[piVar15[iVar1] + lVar21],iVar12,prow,iVar1,val,eps);
    piVar15 = (this->u).col.start;
    lVar21 = lVar21 + 1;
    iVar12 = iVar12 + 1;
    piVar13 = (this->u).col.idx;
  }
  iVar2 = (this->u).col.len[iVar1];
  for (lVar21 = (long)((int)lVar21 + 1); (int)lVar21 < iVar2; lVar21 = lVar21 + 1) {
    updateRow(this,(this->u).col.idx[(this->u).col.start[iVar1] + lVar21],iVar12,prow,iVar1,val,eps)
    ;
    iVar12 = iVar12 + 1;
  }
  piVar7 = (this->temp).s_cact;
  piVar14 = (this->u).col.len + iVar1;
  *piVar14 = *piVar14 - piVar7[iVar1];
  piVar14 = (this->u).row.idx;
  lVar21 = (long)(this->u).row.start[prow];
  lVar19 = iVar16 + lVar21;
  pdVar9 = this->work;
  piVar8 = (this->temp).s_mark;
  pPVar4 = (this->temp).pivot_colNZ;
  pPVar5 = (this->temp).pivot_col;
  for (; lVar21 < lVar19; lVar21 = lVar21 + 1) {
    iVar12 = piVar14[lVar21];
    pdVar9[iVar12] = 0.0;
    piVar8[iVar12] = 0;
    iVar1 = piVar7[iVar12];
    pPVar6 = pPVar4[iVar1].next;
    pPVar5[iVar12].next = pPVar6;
    pPVar6->prev = pPVar5 + iVar12;
    pPVar5[iVar12].prev = pPVar4 + iVar1;
    pPVar4[iVar1].next = pPVar5 + iVar12;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}